

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdCreateConfidentialSighash
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,char *pubkey,
              char *redeem_script,int64_t value_satoshi,char *value_commitment,int sighash_type,
              bool sighash_anyone_can_pay,char **sighash)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RDX;
  char *in_RSI;
  char *in_R9;
  Amount AVar4;
  char *in_stack_00000008;
  int64_t in_stack_00000010;
  char *in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  undefined8 *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  string sighash_bytes;
  SigHashType sighashtype;
  ElementsTransactionApi api;
  ConfidentialValue value;
  Pubkey pubkey_obj;
  Script redeem_script_obj;
  ByteData key_data;
  HashType core_hash_type;
  AddressType addr_type;
  ByteData *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  string *in_stack_fffffffffffffad0;
  CfdError in_stack_fffffffffffffadc;
  CfdException *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffb20;
  allocator local_409;
  string local_408;
  Txid local_3e8;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [24];
  ByteData *in_stack_fffffffffffffc78;
  SigHashAlgorithm in_stack_fffffffffffffc84;
  Txid *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  ElementsTransactionApi *in_stack_fffffffffffffc98;
  ConfidentialValue *in_stack_fffffffffffffcb0;
  HashType in_stack_fffffffffffffcb8;
  SigHashType *in_stack_fffffffffffffcc0;
  Amount local_318;
  ConfidentialValue local_308;
  ConfidentialValue local_2e0;
  ByteData local_2b8;
  allocator local_299;
  string local_298;
  Pubkey local_278;
  undefined1 local_25a;
  allocator local_259;
  string local_258 [32];
  CfdSourceLocation local_238;
  ByteData local_220;
  allocator local_201;
  string local_200;
  Script local_1e0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  CfdSourceLocation local_180;
  ByteData local_168;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  int local_10c;
  AddressType local_108;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_31;
  char *local_30;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_31 = in_stack_00000028 & 1;
  local_30 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x72d;
    local_60.funcname = "CfdCreateConfidentialSighash";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    if (in_stack_00000030 == (undefined8 *)0x0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x739;
      local_e0.funcname = "CfdCreateConfidentialSighash";
      cfd::core::logger::warn<>(&local_e0,"sighash is null.");
      local_102 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Failed to parameter. sighash is null.",&local_101);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
      local_102 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_108 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffffb20 >> 0x20))
    ;
    switch(local_108) {
    case kP2shAddress:
      local_10c = 1;
      break;
    case kP2pkhAddress:
      local_10c = 0;
      break;
    case kP2wshAddress:
    case kP2shP2wshAddress:
      local_10c = 3;
      break;
    case kP2wpkhAddress:
    case kP2shP2wpkhAddress:
      local_10c = 2;
      break;
    default:
      local_128.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_128.filename = local_128.filename + 1;
      local_128.line = 0x753;
      local_128.funcname = "CfdCreateConfidentialSighash";
      cfd::core::logger::warn<>(&local_128,"hashtype is illegal.");
      local_14a = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Failed to parameter. hashtype is illegal.",&local_149)
      ;
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
      local_14a = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ByteData::ByteData(&local_168);
    if ((local_10c == 1) || (local_10c == 3)) {
      bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
      if (bVar1) {
        local_180.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
        local_180.filename = local_180.filename + 1;
        local_180.line = 0x75d;
        local_180.funcname = "CfdCreateConfidentialSighash";
        cfd::core::logger::warn<>(&local_180,"redeem script is null or empty.");
        local_1a2 = 1;
        uVar2 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1a0,"Failed to parameter. redeem script is null or empty.",&local_1a1);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
        local_1a2 = 0;
        __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_200,in_stack_00000008,&local_201);
      cfd::core::Script::Script(&local_1e0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      cfd::core::Script::GetData(&local_220,&local_1e0);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffab8);
      cfd::core::ByteData::~ByteData((ByteData *)0x5b604d);
      cfd::core::Script::~Script
                ((Script *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
    }
    else {
      bVar1 = cfd::capi::IsEmptyString(local_30);
      if (bVar1) {
        local_238.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                     ,0x2f);
        local_238.filename = local_238.filename + 1;
        local_238.line = 0x766;
        local_238.funcname = "CfdCreateConfidentialSighash";
        cfd::core::logger::warn<>(&local_238,"pubkey is null or empty.");
        local_25a = 1;
        uVar2 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_258,"Failed to parameter. pubkey is null or empty.",&local_259);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
        local_25a = 0;
        __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,local_30,&local_299);
      cfd::core::Pubkey::Pubkey(&local_278,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      cfd::core::Pubkey::GetData(&local_2b8,&local_278);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 in_stack_fffffffffffffab8);
      cfd::core::ByteData::~ByteData((ByteData *)0x5b62fe);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5b630b);
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_2e0);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000018);
    if (bVar1) {
      AVar4 = cfd::core::Amount::CreateBySatoshiAmount(in_stack_00000010);
      in_stack_fffffffffffffb20 = (string *)AVar4.amount_;
      local_318.ignore_check_ = AVar4.ignore_check_;
      local_318.amount_ = (int64_t)in_stack_fffffffffffffb20;
      cfd::core::ConfidentialValue::ConfidentialValue(&local_308,&local_318);
      cfd::core::ConfidentialValue::operator=(&local_2e0,&local_308);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b6434);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffc90,in_stack_00000018,
                 (allocator *)&stack0xfffffffffffffc8f);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&stack0xfffffffffffffcb0,(string *)&stack0xfffffffffffffc90);
      cfd::core::ConfidentialValue::operator=
                (&local_2e0,(ConfidentialValue *)&stack0xfffffffffffffcb0);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b64eb);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc8f);
    }
    cfd::api::ElementsTransactionApi::ElementsTransactionApi
              ((ElementsTransactionApi *)&stack0xfffffffffffffc8e);
    cfd::core::SigHashType::Create
              ((SigHashType *)&stack0xfffffffffffffc80,in_stack_00000020,(bool)(local_31 & 1),false)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,local_18,&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,local_20,&local_409);
    cfd::core::Txid::Txid(&local_3e8,&local_408);
    cfd::api::ElementsTransactionApi::CreateSignatureHash
              (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               in_stack_fffffffffffffc84,in_stack_fffffffffffffc78,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0);
    cfd::core::Txid::~Txid((Txid *)0x5b6695);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffb20);
    *in_stack_00000030 = pcVar3;
    local_4 = 0;
    std::__cxx11::string::~string(local_3a0);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5b6712);
    cfd::core::ByteData::~ByteData((ByteData *)0x5b671f);
    return local_4;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0x733;
  local_a0.funcname = "CfdCreateConfidentialSighash";
  cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
  local_c2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0);
  local_c2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialSighash(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int hash_type, const char* pubkey, const char* redeem_script,
    int64_t value_satoshi, const char* value_commitment, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    ByteData key_data;
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      Script redeem_script_obj = Script(redeem_script);
      key_data = redeem_script_obj.GetData();
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      Pubkey pubkey_obj = Pubkey(pubkey);
      key_data = pubkey_obj.GetData();
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      value = ConfidentialValue(value_commitment);
    }

    ElementsTransactionApi api;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    std::string sighash_bytes = api.CreateSignatureHash(
        std::string(tx_hex_string), Txid(std::string(txid)), vout, key_data,
        value, core_hash_type, sighashtype);
    *sighash = CreateString(sighash_bytes);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}